

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QLineF * __thiscall QVariant::toLineF(QLineF *__return_storage_ptr__,QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  qreal qVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QLineF>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar8 = ::comparesEqual(&local_28,&local_20);
  if (bVar8) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    uVar3 = *(undefined4 *)&(this->d).data;
    uVar4 = *(undefined4 *)((long)&(this->d).data + 4);
    uVar5 = *(undefined4 *)((long)&(this->d).data + 8);
    uVar6 = *(undefined4 *)((long)&(this->d).data + 0xc);
    qVar7 = *(qreal *)&(this->d).field_0x18;
    (__return_storage_ptr__->pt2).xp = *(qreal *)((long)&(this->d).data + 0x10);
    (__return_storage_ptr__->pt2).yp = qVar7;
    *(undefined4 *)&(__return_storage_ptr__->pt1).xp = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->pt1).xp + 4) = uVar4;
    *(undefined4 *)&(__return_storage_ptr__->pt1).yp = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->pt1).yp + 4) = uVar6;
  }
  else {
    (__return_storage_ptr__->pt1).xp = 0.0;
    (__return_storage_ptr__->pt1).yp = 0.0;
    (__return_storage_ptr__->pt2).xp = 0.0;
    (__return_storage_ptr__->pt2).yp = 0.0;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_20,
                       __return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QLineF QVariant::toLineF() const
{
    return qvariant_cast<QLineF>(*this);
}